

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

int __thiscall
Analysis::LexicalAnalysis::PreTokenize
          (LexicalAnalysis *this,vector<char,_std::allocator<char>_> *Code,
          vector<int,_std::allocator<int>_> *Table)

{
  undefined8 this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  reference pcVar4;
  reference pcVar5;
  reference piVar6;
  reference pvVar7;
  iterator iStack_190;
  int i;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int local_170;
  value_type_conflict1 vStack_16c;
  bool flag;
  int counter;
  value_type_conflict1 local_164 [2];
  char local_159;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_158;
  char b;
  iterator __end2_3;
  iterator __begin2_3;
  string *__range2_3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_138;
  char s;
  iterator __end2_2;
  iterator __begin2_2;
  string *__range2_2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_118;
  char q;
  iterator __end2_1;
  iterator __begin2_1;
  string *__range2_1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_f8;
  char o;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_d8;
  const_iterator c;
  string local_c8 [8];
  string quote;
  string local_a0 [8];
  string brackets;
  string local_78 [8];
  string symbols;
  allocator<char> local_41;
  string local_40 [8];
  string operators;
  vector<int,_std::allocator<int>_> *Table_local;
  vector<char,_std::allocator<char>_> *Code_local;
  LexicalAnalysis *this_local;
  
  operators.field_2._8_8_ = Table;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"+-*/=",&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"#\'$%&!/\\:.,;",(allocator<char> *)(brackets.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(brackets.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"(){}[]",(allocator<char> *)(quote.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(quote.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"\"",(allocator<char> *)((long)&c._M_current + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&c._M_current + 7));
  local_d8._M_current = (char *)std::vector<char,_std::allocator<char>_>::cbegin(Code);
  while( true ) {
    __range2 = (string *)std::vector<char,_std::allocator<char>_>::cend(Code);
    bVar1 = __gnu_cxx::operator!=
                      (&local_d8,
                       (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *
                       )&__range2);
    this_00 = operators.field_2._8_8_;
    if (!bVar1) break;
    __end2._M_current = (char *)std::__cxx11::string::begin();
    _Stack_f8._M_current = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff08), bVar1) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      __range2_1._7_1_ = *pcVar4;
      pcVar5 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&local_d8);
      if (*pcVar5 == __range2_1._7_1_) {
        __range2_1._0_4_ = 1;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)operators.field_2._8_8_,
                   (value_type_conflict1 *)&__range2_1);
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    __end2_1._M_current = (char *)std::__cxx11::string::begin();
    _Stack_118._M_current = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffee8), bVar1) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2_1);
      __range2_2._7_1_ = *pcVar4;
      pcVar5 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&local_d8);
      if (*pcVar5 == __range2_2._7_1_) {
        __range2_2._0_4_ = 7;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)operators.field_2._8_8_,
                   (value_type_conflict1 *)&__range2_2);
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2_1);
    }
    __end2_2._M_current = (char *)std::__cxx11::string::begin();
    _Stack_138._M_current = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=(&__end2_2,&stack0xfffffffffffffec8), bVar1) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2_2);
      __range2_3._7_1_ = *pcVar4;
      pcVar5 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&local_d8);
      if (*pcVar5 == __range2_3._7_1_) {
        __range2_3._0_4_ = 2;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)operators.field_2._8_8_,
                   (value_type_conflict1 *)&__range2_3);
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2_2);
    }
    __end2_3._M_current = (char *)std::__cxx11::string::begin();
    _Stack_158._M_current = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=(&__end2_3,&stack0xfffffffffffffea8), bVar1) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2_3);
      local_159 = *pcVar4;
      pcVar5 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&local_d8);
      if (*pcVar5 == local_159) {
        local_164[1] = 3;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)operators.field_2._8_8_,local_164 + 1);
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2_3);
    }
    pcVar5 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_d8);
    if (*pcVar5 == ' ') {
      local_164[0] = 6;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)operators.field_2._8_8_,local_164);
    }
    pcVar5 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_d8);
    iVar3 = isalpha((int)*pcVar5);
    if (iVar3 == 0) {
      pcVar5 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&local_d8);
      iVar3 = isdigit((int)*pcVar5);
      if (iVar3 != 0) {
        vStack_16c = 5;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)operators.field_2._8_8_,
                   &stack0xfffffffffffffe94);
      }
    }
    else {
      counter = 4;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)operators.field_2._8_8_,&counter);
    }
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&local_d8);
  }
  local_170 = 0;
  bVar1 = false;
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)operators.field_2._8_8_);
  iStack_190 = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)this_00);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffe70), bVar2) {
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    if (*piVar6 == 7) {
      bVar1 = (bool)(bVar1 ^ 1);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)operators.field_2._8_8_,
                          (long)local_170);
      *pvVar7 = 10;
    }
    else if (bVar1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)operators.field_2._8_8_,
                          (long)local_170);
      *pvVar7 = 10;
    }
    local_170 = local_170 + 1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return 0;
}

Assistant:

int LexicalAnalysis::PreTokenize(std::vector<char> &Code, std::vector<int> &Table) {

        std::string operators = "+-*/=";
        std::string symbols = "#'$%&!/\\:.,;";
        std::string brackets = "(){}[]";
        std::string quote = "\"";

        //check which type the char of the actual index is and
        //assign its type to the Table vector at a parallel index
        for (auto c = Code.cbegin(); c != Code.cend(); ++c) {
            for (auto o : operators) {
                if (*c == o) {
                    Table.push_back(op);
                }
            }
            for (auto q : quote) {
                if (*c == q) {
                    Table.push_back(quotes);
                }
            }
            for (auto s : symbols) {
                if (*c == s) {
                    Table.push_back(symbol);
                }
            }
            for (auto b : brackets) {
                if (*c == b) {
                    Table.push_back(bracket);
                }
            }

            if (*c == ' '){
                Table.push_back(empty);
            }
            if (std::isalpha(*c)) {
                Table.push_back(letter);
            } else if (std::isdigit(*c)) {
                Table.push_back(digit);
            }
        }

        int counter = 0;
        bool flag = false;
        for (int i : Table) {

            if (i == quotes) {
                flag = !flag;
                Table[counter] = 10;
            } else if (flag == true) {
                Table[counter] = 10;
            }
            counter++;
        }
        return 0;
    }